

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node_unlink.c
# Opt level: O1

mpt_node * mpt_node_unlink(mpt_node *curr)

{
  mpt_node *pmVar1;
  int *piVar2;
  mpt_node **ppmVar3;
  
  if (curr == (mpt_node *)0x0) {
    piVar2 = __errno_location();
    *piVar2 = 0x16;
    return (mpt_node *)0x0;
  }
  pmVar1 = curr->next;
  if (pmVar1 != (mpt_node *)0x0) {
    pmVar1->prev = curr->prev;
  }
  if (curr->prev == (mpt_node *)0x0) {
    if (curr->parent == (mpt_node *)0x0) goto LAB_00116ae8;
    ppmVar3 = &curr->parent->children;
  }
  else {
    ppmVar3 = &curr->prev->next;
  }
  *ppmVar3 = pmVar1;
LAB_00116ae8:
  curr->next = (mpt_node *)0x0;
  curr->prev = (mpt_node *)0x0;
  curr->parent = (mpt_node *)0x0;
  return pmVar1;
}

Assistant:

extern MPT_STRUCT(node) *mpt_node_unlink(MPT_STRUCT(node) *curr)
{
	MPT_STRUCT(node)  *next;
	
	if (!curr) {
		errno = EINVAL;
		return 0;
	}
	/* change predecessor of successor */
	if ((next = curr->next)) {
		next->prev = curr->prev;
	}
	/* change successor of predecessor */
	if (curr->prev) {
		curr->prev->next = next;
	}
	/* if no predecessor change child link of parent (if exists) */
	else if (curr->parent) {
		curr->parent->children = next;
	}
	curr->parent = curr->next = curr->prev = 0;
	
	return next;
}